

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedCombinedCase::init
          (ComputeShaderGeneratedCombinedCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  int iVar1;
  ShaderProgram *pSVar2;
  ProgramSources *sources;
  TestError *this_00;
  string local_140;
  undefined1 local_120 [40];
  ProgramSources local_f8;
  
  pSVar2 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context)->m_renderCtx;
  memset(&local_f8,0,0xac);
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f8._193_8_ = 0;
  Functional::(anonymous_namespace)::ComputeShaderGeneratedCase::genComputeSource_abi_cxx11_
            (&local_140,this,(this->super_ComputeShaderGeneratedCase).m_computeCmd,
             (this->super_ComputeShaderGeneratedCase).m_computeData,
             (this->super_ComputeShaderGeneratedCase).m_computeIndices);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_120,&local_140);
  sources = glu::ProgramSources::operator<<(&local_f8,(ShaderSource *)local_120);
  glu::ShaderProgram::ShaderProgram(pSVar2,renderCtx,sources);
  this->m_computeProgram = pSVar2;
  std::__cxx11::string::~string((string *)(local_120 + 8));
  std::__cxx11::string::~string((string *)&local_140);
  glu::ProgramSources::~ProgramSources(&local_f8);
  pSVar2 = this->m_computeProgram;
  glu::operator<<(((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx)->m_log,pSVar2);
  if ((this->m_computeProgram->m_program).m_info.linkOk != false) {
    iVar1 = ComputeShaderGeneratedCase::init
                      (&this->super_ComputeShaderGeneratedCase,(EVP_PKEY_CTX *)pSVar2);
    return iVar1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Failed to compile compute shader.",(allocator<char> *)local_120);
  tcu::TestError::TestError(this_00,(string *)&local_f8);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ComputeShaderGeneratedCombinedCase::init (void)
{
	// generate compute shader

	m_computeProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genComputeSource(m_computeCmd, m_computeData, m_computeIndices)));
	m_testCtx.getLog() << *m_computeProgram;

	if (!m_computeProgram->isOk())
		throw tcu::TestError("Failed to compile compute shader.");

	// init parent
	ComputeShaderGeneratedCase::init();
}